

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::setOptimizer
          (MultipleShootingSolver *this,shared_ptr<iDynTree::optimization::Optimizer> *optimizer)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  __shared_ptr *in_RSI;
  double plusInfinity;
  double minusInfinity;
  shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription>
  *in_stack_ffffffffffffff78;
  shared_ptr<iDynTree::optimization::OptimizationProblem> *in_stack_ffffffffffffff80;
  undefined1 local_28 [39];
  bool local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x316657);
    std::shared_ptr<iDynTree::optimization::OptimizationProblem>::
    shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,void>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    iVar2 = (*peVar3->_vptr_Optimizer[3])(peVar3,local_28);
    std::shared_ptr<iDynTree::optimization::OptimizationProblem>::~shared_ptr
              ((shared_ptr<iDynTree::optimization::OptimizationProblem> *)0x3166a1);
    if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
      std::shared_ptr<iDynTree::optimization::Optimizer>::operator=
                ((shared_ptr<iDynTree::optimization::Optimizer> *)in_stack_ffffffffffffff80,
                 (shared_ptr<iDynTree::optimization::Optimizer> *)in_stack_ffffffffffffff78);
      peVar4 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x316710);
      peVar3 = std::
               __shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x316723);
      (*peVar3->_vptr_Optimizer[0xb])();
      MultipleShootingTranscription::setPlusInfinity(peVar4,plusInfinity);
      peVar4 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x316744);
      peVar3 = std::
               __shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x316757);
      (*peVar3->_vptr_Optimizer[10])();
      MultipleShootingTranscription::setMinusInfinity(peVar4,minusInfinity);
      local_1 = true;
    }
    else {
      iDynTree::reportError
                ("MultipleShootingSolver","setOptimizer",
                 "Cannot use the selected optimizer to solve the specified optimal control problem."
                );
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError("MultipleShootingSolver","setOptimizer","Empty optimizer pointer");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MultipleShootingSolver::setOptimizer(std::shared_ptr<optimization::Optimizer> optimizer)
        {
            if (!optimizer) {
                reportError("MultipleShootingSolver", "setOptimizer", "Empty optimizer pointer");
                return false;
            }

            if (!(optimizer->setProblem(m_transcription))){
                reportError("MultipleShootingSolver", "setOptimizer", "Cannot use the selected optimizer to solve the specified optimal control problem.");
                return false;
            }

            m_optimizer = optimizer;

            m_transcription->setPlusInfinity(m_optimizer->plusInfinity());

            m_transcription->setMinusInfinity(m_optimizer->minusInfinity());

            return true;
        }